

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_get_populated_multiple_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ion_dictionary_t dict;
  char key [9];
  ion_dictionary_handler_t handler;
  int local_ac;
  ion_dictionary_t local_a8;
  char local_90 [16];
  ion_dictionary_handler_t local_80;
  
  local_90[8] = 0;
  local_90[0] = '\0';
  local_90[1] = '\0';
  local_90[2] = '\0';
  local_90[3] = '\0';
  local_90[4] = '\0';
  local_90[5] = '\0';
  local_90[6] = '\0';
  local_90[7] = '\0';
  bhdct_setup_string_key(tc,&local_80,&local_a8,ion_fill_low);
  iVar3 = 0;
  uVar2 = 0;
  do {
    sprintf(local_90,"k%d",uVar2);
    local_ac = iVar3;
    bhdct_get(tc,&local_a8,local_90,&local_ac,'\0',1);
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
    iVar3 = iVar3 + 2;
  } while (uVar1 != 10);
  bhdct_delete_dictionary(tc,&local_a8);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_populated_multiple_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_low);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_LOW_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}